

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getE5B9G9R9
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_1U> *this)

{
  __assert_fail("3 <= componentCount",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x3c1,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getE5B9G9R9() const [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual std::vector<uint8_t> getE5B9G9R9() const override {
        assert(3 <= componentCount);
        assert(std::is_floating_point_v<componentType>);

        std::vector<uint8_t> data(height * width * 4);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                auto* target = data.data() + (y * width + x) * 4;

                const auto pixel = (*this)(x, y);
                const auto r = pixel[0];
                const auto g = pixel[1];
                const auto b = pixel[2];
                const auto outValue = glm::packF3x9_E1x5(glm::vec3(r, g, b));
                std::memcpy(target, &outValue, sizeof(outValue));
            }
        }

        return data;
    }